

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O2

apx_error_t apx_file_create(apx_file_t *self,rmf_fileInfo_t *file_info)

{
  rmf_fileInfo_t *self_00;
  _Bool _Var1;
  apx_error_t aVar2;
  apx_fileType_t aVar3;
  
  if (file_info == (rmf_fileInfo_t *)0x0 || self == (apx_file_t *)0x0) {
    aVar2 = 1;
  }
  else {
    self->is_file_open = false;
    self->has_first_write = false;
    self->apx_file_type = '\0';
    (self->notification_handler).arg = (void *)0x0;
    (self->notification_handler).open_notify = (apx_file_open_close_notify_func *)0x0;
    (self->notification_handler).close_notify = (apx_file_open_close_notify_func *)0x0;
    (self->notification_handler).write_notify = (apx_file_write_notify_func *)0x0;
    self->file_manager = (apx_fileManager_tag *)0x0;
    adt_list_create(&self->event_listeners,apx_fileEventListener_vdelete);
    self_00 = &self->file_info;
    aVar2 = rmf_fileInfo_create_copy(self_00,file_info);
    if (aVar2 == 0) {
      _Var1 = rmf_fileInfo_name_ends_with(self_00,".apx");
      aVar3 = '\x01';
      if (!_Var1) {
        _Var1 = rmf_fileInfo_name_ends_with(self_00,".out");
        aVar3 = '\x02';
        if (!_Var1) {
          _Var1 = rmf_fileInfo_name_ends_with(self_00,".in");
          aVar3 = '\x03';
          if (!_Var1) {
            _Var1 = rmf_fileInfo_name_ends_with(self_00,".cout");
            aVar3 = '\x04';
            if (!_Var1) {
              _Var1 = rmf_fileInfo_name_ends_with(self_00,".cin");
              aVar3 = _Var1 * '\x05';
            }
          }
        }
      }
      self->apx_file_type = aVar3;
      aVar2 = 0;
      pthread_mutex_init((pthread_mutex_t *)&self->lock,(pthread_mutexattr_t *)0x0);
    }
  }
  return aVar2;
}

Assistant:

apx_error_t apx_file_create(apx_file_t* self, const rmf_fileInfo_t* file_info)
{
   if ( (self != NULL) && (file_info != NULL))
   {
      apx_error_t retval = APX_NO_ERROR;
      self->is_file_open = false;
      self->has_first_write = false;
      self->file_manager = (apx_fileManager_t*) NULL;
      self->apx_file_type = APX_UNKNOWN_FILE_TYPE;
      memset(&self->notification_handler, 0, sizeof(apx_fileNotificationHandler_t));
      adt_list_create(&self->event_listeners, apx_fileEventListener_vdelete);
      retval = rmf_fileInfo_create_copy(&self->file_info, file_info);
      if (retval == APX_NO_ERROR)
      {
         apx_file_calc_file_type(self);
         MUTEX_INIT(self->lock);
      }
      return retval;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}